

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface_p.h
# Opt level: O3

void __thiscall QWindowSystemInterfacePrivate::TabletEvent::~TabletEvent(TabletEvent *this)

{
  Data *pDVar1;
  
  (this->super_PointerEvent).super_InputEvent.super_UserEvent.super_WindowSystemEvent.
  _vptr_WindowSystemEvent = (_func_int **)&PTR__UserEvent_007d41f0;
  pDVar1 = (this->super_PointerEvent).super_InputEvent.super_UserEvent.window.wp.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      pDVar1 = (this->super_PointerEvent).super_InputEvent.super_UserEvent.window.wp.d;
      if (pDVar1 == (Data *)0x0) {
        pDVar1 = (Data *)0x0;
      }
      operator_delete(pDVar1);
    }
  }
  operator_delete(this,0x98);
  return;
}

Assistant:

class Q_GUI_EXPORT TabletEvent : public PointerEvent {
    public:
        // TODO take QPointingDevice* instead of types and IDs
        static void handleTabletEvent(QWindow *w, const QPointF &local, const QPointF &global,
                                      int device, int pointerType, Qt::MouseButtons buttons, qreal pressure, qreal xTilt, qreal yTilt,
                                      qreal tangentialPressure, qreal rotation, int z, qint64 uid,
                                      Qt::KeyboardModifiers modifiers = Qt::NoModifier);
        static void setPlatformSynthesizesMouse(bool v);

        TabletEvent(QWindow *w, ulong time, const QPointF &local, const QPointF &global,
                    const QPointingDevice *device, Qt::MouseButtons b, qreal pressure, qreal xTilt, qreal yTilt, qreal tpressure,
                    qreal rotation, int z, Qt::KeyboardModifiers mods)
            : PointerEvent(w, time, Tablet, mods, device),
              buttons(b), local(local), global(global),
              pressure(pressure), xTilt(xTilt), yTilt(yTilt), tangentialPressure(tpressure),
              rotation(rotation), z(z) { }
        Qt::MouseButtons buttons;
        QPointF local;
        QPointF global;
        qreal pressure;
        qreal xTilt;
        qreal yTilt;
        qreal tangentialPressure;
        qreal rotation;
        int z;
        static bool platformSynthesizesMouse;
    }